

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-io.h
# Opt level: O0

void __thiscall
mp::SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>::
HandleFeasibleSolution
          (SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter> *this,
          int status,CStringRef message,double *values,double *dual_values,double param_6)

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  Result RVar1;
  Result RVar2;
  int iVar3;
  char *pcVar4;
  CStringRef filename_00;
  SolFileWriter *this_00;
  long in_RCX;
  long in_RDI;
  long in_R8;
  MemoryWriter filename;
  SolutionAdapter<StrictMockProblemBuilder> sol;
  char *solution_stub;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  double *in_stack_fffffffffffffbe8;
  ArrayRef<double> *in_stack_fffffffffffffbf8;
  ArrayRef<long> *in_stack_fffffffffffffc00;
  BasicMemoryWriter<char,_std::allocator<char>_> *this_01;
  char *pcVar5;
  Result in_stack_fffffffffffffc14;
  int status_00;
  undefined4 in_stack_fffffffffffffc20;
  ArrayRef<double> *dual_values_00;
  int on;
  BasicCStringRef<char> local_3b0 [5];
  BasicMemoryWriter<char,_std::allocator<char>_> local_381;
  char local_158 [288];
  char *local_38;
  long local_28;
  long local_20;
  BasicCStringRef<char> local_8;
  
  *(int *)(in_RDI + 0x80) = *(int *)(in_RDI + 0x80) + 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_38 = BasicSolver::solution_stub((BasicSolver *)0x229a1c);
  if (*local_38 != '\0') {
    dual_values_00 = *(ArrayRef<double> **)(in_RDI + 0x50);
    pcVar4 = fmt::BasicCStringRef<char>::c_str(&local_8);
    on = (int)pcVar4;
    ArrayRef<long>::ArrayRef(in_stack_fffffffffffffc00,(ArrayRef<long> *)in_stack_fffffffffffffbf8);
    if (local_20 == 0) {
      RVar1 = 0;
    }
    else {
      RVar1 = MockProblemBuilder::num_vars
                        ((MockProblemBuilder *)
                         CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    }
    MakeArrayRef<double>
              (in_stack_fffffffffffffbe8,
               CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    if (local_28 == 0) {
      RVar2 = 0;
    }
    else {
      RVar2 = MockProblemBuilder::num_algebraic_cons
                        ((MockProblemBuilder *)
                         CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
      in_stack_fffffffffffffc14 = RVar2;
    }
    status_00 = (int)((ulong)local_28 >> 0x20);
    pcVar4 = local_158;
    MakeArrayRef<double>
              (in_stack_fffffffffffffbe8,
               CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    iVar3 = BasicSolver::objno_used
                      ((BasicSolver *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0))
    ;
    pcVar5 = pcVar4;
    SolutionAdapter<StrictMockProblemBuilder>::SolutionAdapter
              ((SolutionAdapter<StrictMockProblemBuilder> *)
               CONCAT44(RVar1,in_stack_fffffffffffffc20),status_00,
               (StrictMockProblemBuilder *)CONCAT44(in_stack_fffffffffffffc14,RVar2),pcVar4,
               in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,dual_values_00,on);
    ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x229b8c);
    ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x229b99);
    ArrayRef<long>::~ArrayRef((ArrayRef<long> *)0x229ba6);
    this_01 = &local_381;
    std::allocator<char>::allocator();
    fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
              (this_01,(allocator<char> *)in_stack_fffffffffffffbf8);
    std::allocator<char>::~allocator((allocator<char> *)&local_381);
    fmt::BasicStringRef<char>::BasicStringRef
              ((BasicStringRef<char> *)CONCAT44(in_stack_fffffffffffffbe4,iVar3),pcVar4);
    value.size_._0_4_ = RVar2;
    value.data_ = pcVar5;
    value.size_._4_4_ = in_stack_fffffffffffffc14;
    fmt::BasicWriter<char>::operator<<(&this_01->super_BasicWriter<char>,value);
    filename_00.data_ =
         (char *)fmt::BasicWriter<char>::operator<<
                           ((BasicWriter<char> *)CONCAT44(in_stack_fffffffffffffbe4,iVar3),
                            (int)((ulong)pcVar4 >> 0x20));
    fmt::BasicStringRef<char>::BasicStringRef
              ((BasicStringRef<char> *)CONCAT44(in_stack_fffffffffffffbe4,iVar3),pcVar4);
    value_00.size_._0_4_ = RVar2;
    value_00.data_ = pcVar5;
    value_00.size_._4_4_ = in_stack_fffffffffffffc14;
    fmt::BasicWriter<char>::operator<<(&this_01->super_BasicWriter<char>,value_00);
    this_00 = (SolFileWriter *)
              fmt::BasicWriter<char>::c_str
                        ((BasicWriter<char> *)CONCAT44(in_stack_fffffffffffffbe4,iVar3));
    fmt::BasicCStringRef<char>::BasicCStringRef(local_3b0,(char *)this_00);
    SolFileWriter::Write<mp::SolutionAdapter<StrictMockProblemBuilder>>
              (this_00,filename_00,
               (SolutionAdapter<StrictMockProblemBuilder> *)
               CONCAT44(in_stack_fffffffffffffbe4,iVar3));
    fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter
              ((BasicMemoryWriter<char,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbe4,iVar3));
    SolutionAdapter<StrictMockProblemBuilder>::~SolutionAdapter
              ((SolutionAdapter<StrictMockProblemBuilder> *)
               CONCAT44(in_stack_fffffffffffffbe4,iVar3));
  }
  return;
}

Assistant:

void SolutionWriterImpl<Solver, PB, Writer>::
HandleFeasibleSolution(
    int status, fmt::CStringRef message, const double *values,
    const double *dual_values, double) {
  ++num_solutions_;
  const char *solution_stub = solver_.solution_stub();
  if (!*solution_stub)
    return;
  SolutionAdapter<PB> sol(
        status, &builder_, message.c_str(), options_,
        MakeArrayRef(values, values ? builder_.num_vars() : 0),
        MakeArrayRef(dual_values,
                     dual_values ? builder_.num_algebraic_cons() : 0),
        solver_.objno_used());
  fmt::MemoryWriter filename;
  filename << solution_stub << num_solutions_ << ".sol";
  this->Write(filename.c_str(), sol);
}